

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

StatementBlockKind slang::ast::SemanticFacts::getStatementBlockKind(BlockStatementSyntax *syntax)

{
  TokenKind TVar1;
  BlockStatementSyntax *syntax_local;
  StatementBlockKind local_4;
  
  if ((syntax->super_StatementSyntax).super_SyntaxNode.kind == SequentialBlockStatement) {
    local_4 = Sequential;
  }
  else {
    TVar1 = (syntax->end).kind;
    if (TVar1 == JoinAnyKeyword) {
      local_4 = JoinAny;
    }
    else if (TVar1 == JoinNoneKeyword) {
      local_4 = JoinNone;
    }
    else {
      local_4 = JoinAll;
    }
  }
  return local_4;
}

Assistant:

StatementBlockKind SemanticFacts::getStatementBlockKind(const BlockStatementSyntax& syntax) {
    if (syntax.kind == SyntaxKind::SequentialBlockStatement)
        return StatementBlockKind::Sequential;

    SLANG_ASSERT(syntax.kind == SyntaxKind::ParallelBlockStatement);
    switch (syntax.end.kind) {
        case TokenKind::JoinAnyKeyword:
            return StatementBlockKind::JoinAny;
        case TokenKind::JoinNoneKeyword:
            return StatementBlockKind::JoinNone;
        default:
            return StatementBlockKind::JoinAll;
    }
}